

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

int __thiscall
EnvironmentNAVXYTHETALAT::GetTrueCost(EnvironmentNAVXYTHETALAT *this,int parentID,int childID)

{
  value_type pEVar1;
  value_type pEVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  reference ppEVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  SBPL_Exception *this_00;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int cost;
  EnvNAVXYTHETALATHashEntry_t *hash;
  int newTheta;
  int newY;
  int newX;
  EnvNAVXYTHETALATAction_t *nav3daction;
  int i;
  EnvNAVXYTHETALATHashEntry_t *toHash;
  EnvNAVXYTHETALATHashEntry_t *fromHash;
  char *in_stack_ffffffffffffff68;
  code *local_88;
  int local_2c;
  int local_4;
  
  ppEVar6 = std::
            vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
            operator[]((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                        *)(in_RDI + 0x34),(long)in_ESI);
  pEVar1 = *ppEVar6;
  ppEVar6 = std::
            vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
            operator[]((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                        *)(in_RDI + 0x34),(long)in_EDX);
  pEVar2 = *ppEVar6;
  local_2c = 0;
  do {
    if ((int)in_RDI[0x1f] <= local_2c) {
      this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(this_00,in_stack_ffffffffffffff68);
      __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    lVar7 = *(long *)(in_RDI[0x1d] + (ulong)(uint)(int)pEVar1->Theta * 8) + (long)local_2c * 0x68;
    iVar3 = pEVar1->X + (int)*(char *)(lVar7 + 2);
    iVar4 = pEVar1->Y + (int)*(char *)(lVar7 + 3);
    uVar5 = (**(code **)(*in_RDI + 0x120))(in_RDI,(int)*(char *)(lVar7 + 4));
    uVar8 = (**(code **)(*in_RDI + 0x208))(in_RDI,iVar3,iVar4);
    if ((uVar8 & 1) != 0) {
      local_88 = (code *)in_RDI[0x38];
      if (((ulong)local_88 & 1) != 0) {
        local_88 = *(code **)(local_88 + *(long *)((long)in_RDI + in_RDI[0x39]) + -1);
      }
      piVar9 = (int *)(*local_88)((long *)((long)in_RDI + in_RDI[0x39]),iVar3,iVar4,uVar5);
      if ((piVar9 != (int *)0x0) && (*piVar9 == pEVar2->stateID)) {
        local_4 = (**(code **)(*in_RDI + 0x1b0))
                            (in_RDI,pEVar1->X,pEVar1->Y,(int)pEVar1->Theta,lVar7);
        if (999999999 < local_4) {
          local_4 = -1;
        }
        return local_4;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int EnvironmentNAVXYTHETALAT::GetTrueCost(int parentID, int childID)
{
    EnvNAVXYTHETALATHashEntry_t* fromHash = StateID2CoordTable[parentID];
    EnvNAVXYTHETALATHashEntry_t* toHash = StateID2CoordTable[childID];

    for (int i = 0; i < EnvNAVXYTHETALATCfg.actionwidth; i++) {
        EnvNAVXYTHETALATAction_t* nav3daction = &EnvNAVXYTHETALATCfg.ActionsV[(unsigned int)fromHash->Theta][i];
        int newX = fromHash->X + nav3daction->dX;
        int newY = fromHash->Y + nav3daction->dY;
        int newTheta = normalizeDiscAngle(nav3daction->endtheta);

        // skip the invalid cells
        if (!IsValidCell(newX, newY)) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* hash;
        if ((hash = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
            continue;
        }
        if (hash->stateID != toHash->stateID) {
            continue;
        }

        // get cost
        int cost = GetActionCost(fromHash->X, fromHash->Y, fromHash->Theta, nav3daction);

        if (cost >= INFINITECOST) {
            return -1;
        }
        return cost;
    }
    throw SBPL_Exception("This should never happen! we didn't find the state we need to get the true cost for!");
    return -1;
}